

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool Data649::saveArchive(char *fname,Issues *issues)

{
  int iVar1;
  bool bVar2;
  _Setw _Var3;
  ostream *poVar4;
  const_iterator pvVar5;
  undefined8 in_RSI;
  undefined8 in_RDI;
  value_type_conflict num;
  const_iterator __end3;
  const_iterator __begin3;
  array<int,_6UL> *__range3;
  Draw *draw;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Data649::Draw,_std::allocator<Data649::Draw>_> *__range2;
  Issue *issue;
  const_iterator __end1;
  const_iterator __begin1;
  Issues *__range1;
  ofstream fout;
  vector<Data649::Draw,_std::allocator<Data649::Draw>_> *in_stack_fffffffffffffd38;
  ostream *in_stack_fffffffffffffd40;
  int *local_278;
  __normal_iterator<const_Data649::Draw_*,_std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>_>
  local_258;
  vector<Data649::Draw,_std::allocator<Data649::Draw>_> *local_250;
  int local_248;
  int local_234;
  reference local_230;
  Issue *local_228;
  __normal_iterator<const_Data649::Issue_*,_std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>_>
  local_220;
  undefined8 local_218;
  ostream local_210 [512];
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::ofstream::ofstream(local_210,in_RDI,0x10);
  local_218 = local_10;
  local_220._M_current =
       (Issue *)std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::begin
                          ((vector<Data649::Issue,_std::allocator<Data649::Issue>_> *)
                           in_stack_fffffffffffffd38);
  local_228 = (Issue *)std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>::end
                                 ((vector<Data649::Issue,_std::allocator<Data649::Issue>_> *)
                                  in_stack_fffffffffffffd38);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Data649::Issue_*,_std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>_>
                        *)in_stack_fffffffffffffd40,
                       (__normal_iterator<const_Data649::Issue_*,_std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>_>
                        *)in_stack_fffffffffffffd38);
    if (!bVar2) break;
    local_230 = __gnu_cxx::
                __normal_iterator<const_Data649::Issue_*,_std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>_>
                ::operator*(&local_220);
    local_234 = (int)std::setw(6);
    poVar4 = std::operator<<(local_210,(_Setw)local_234);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_230->year);
    local_248 = (int)std::setw(4);
    poVar4 = std::operator<<(poVar4,(_Setw)local_248);
    std::ostream::operator<<(poVar4,local_230->idYear);
    local_250 = &local_230->draws;
    local_258._M_current =
         (Draw *)std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>::begin
                           (in_stack_fffffffffffffd38);
    std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>::end(in_stack_fffffffffffffd38);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_Data649::Draw_*,_std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>_>
                          *)in_stack_fffffffffffffd40,
                         (__normal_iterator<const_Data649::Draw_*,_std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>_>
                          *)in_stack_fffffffffffffd38);
      if (!bVar2) break;
      __gnu_cxx::
      __normal_iterator<const_Data649::Draw_*,_std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>_>
      ::operator*(&local_258);
      std::operator<<(local_210," ");
      local_278 = std::array<int,_6UL>::begin((array<int,_6UL> *)0x107d1e);
      pvVar5 = std::array<int,_6UL>::end((array<int,_6UL> *)0x107d2d);
      for (; local_278 != pvVar5; local_278 = local_278 + 1) {
        iVar1 = *local_278;
        _Var3 = std::setw(3);
        in_stack_fffffffffffffd40 = std::operator<<(local_210,_Var3);
        std::ostream::operator<<(in_stack_fffffffffffffd40,iVar1);
      }
      __gnu_cxx::
      __normal_iterator<const_Data649::Draw_*,_std::vector<Data649::Draw,_std::allocator<Data649::Draw>_>_>
      ::operator++(&local_258);
    }
    std::ostream::operator<<(local_210,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<const_Data649::Issue_*,_std::vector<Data649::Issue,_std::allocator<Data649::Issue>_>_>
    ::operator++(&local_220);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_210);
  return true;
}

Assistant:

bool saveArchive(const char * fname, const Issues & issues) {
    std::ofstream fout(fname);

    for (auto & issue : issues) {
        fout << std::setw(6) << issue.year << std::setw(4) << issue.idYear;
        for (auto & draw : issue.draws) {
            fout << " ";
            for (auto num : draw.nums) {
                fout << std::setw(3) << num;
            }
        }
        fout << std::endl;
    }

    fout.close();

    return true;
}